

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O0

bool __thiscall capnp::anon_unknown_1::CapnpcCppMain::Slot::isSupersetOf(Slot *this,Slot other)

{
  Section SVar1;
  Section SVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool local_45;
  uint otherStart;
  uint otherBits;
  uint start;
  uint bits;
  Section section;
  Slot *this_local;
  uint uStack_10;
  Slot other_local;
  
  SVar1 = sectionFor(this->whichType);
  this_local._4_2_ = other.whichType;
  SVar2 = sectionFor(this_local._4_2_);
  if (SVar1 == SVar2) {
    if (SVar1 == NONE) {
      other_local._3_1_ = 1;
    }
    else {
      uStack_10 = other.offset;
      if (SVar1 == DATA) {
        uVar3 = typeSizeBits(this->whichType);
        uVar4 = this->offset * uVar3;
        uVar5 = typeSizeBits(this_local._4_2_);
        local_45 = uVar4 <= uStack_10 * uVar5 && uStack_10 * uVar5 + uVar5 <= uVar4 + uVar3;
        other_local._3_1_ = local_45;
      }
      else {
        if (SVar1 != POINTERS) {
          kj::_::unreachable();
        }
        other_local._3_1_ = this->offset == uStack_10;
      }
    }
  }
  else {
    other_local._3_1_ = 0;
  }
  return (bool)other_local._3_1_;
}

Assistant:

bool isSupersetOf(Slot other) const {
      auto section = sectionFor(whichType);
      if (section != sectionFor(other.whichType)) return false;
      switch (section) {
        case Section::NONE:
          return true;  // all voids overlap
        case Section::DATA: {
          auto bits = typeSizeBits(whichType);
          auto start = offset * bits;
          auto otherBits = typeSizeBits(other.whichType);
          auto otherStart = other.offset * otherBits;
          return start <= otherStart && otherStart + otherBits <= start + bits;
        }
        case Section::POINTERS:
          return offset == other.offset;
      }
      KJ_UNREACHABLE;
    }